

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listTest.cpp
# Opt level: O3

void printr<ft::list<int,ft::allocator<int>>>(list<int,_ft::allocator<int>_> *t,char *s)

{
  long lVar1;
  undefined8 in_RAX;
  size_t sVar2;
  ostream *this;
  listNode<int> *plVar3;
  undefined8 uStack_38;
  
  lVar1 = std::cout;
  *(undefined8 *)(tolower + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar1 + -0x18) + 0x10f0c0);
  }
  else {
    sVar2 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," in reverse:",0xc);
  plVar3 = t->m_tail;
  if (plVar3 != t->m_head->next) {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      this = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      std::ostream::operator<<(this,plVar3->prev->data);
      plVar3 = plVar3->prev;
    } while (plVar3 != t->m_head->next);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void	printr(T const & t, char const * s) {
	typename T::const_reverse_iterator	itr;

	std::cout << std::setw(3) << s << " in reverse:";
	for (itr = t.rbegin(); itr != t.rend(); ++itr)
		std::cout << ' ' << *itr;
	std::cout << std::endl;
}